

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O1

void __thiscall
fixedPreciseMeasurement_powroot_Test::TestBody(fixedPreciseMeasurement_powroot_Test *this)

{
  bool bVar1;
  uint extraout_EAX;
  uint extraout_EAX_00;
  char *pcVar2;
  char *in_R9;
  pointer *__ptr;
  double in_XMM1_Qa;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  fixed_precise_measurement m2;
  AssertionResult gtest_ar__1;
  fixed_precise_measurement v1;
  fixed_precise_measurement m1;
  undefined1 local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined1 local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  ulong local_98;
  fixed_precise_measurement local_90;
  AssertHelperData *local_78;
  AssertHelper local_70;
  AssertHelper local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  fixed_precise_measurement local_58;
  undefined1 local_40 [24];
  fixed_precise_measurement local_28;
  
  local_28.value_ = 2.0;
  local_28.units_.multiplier_ = (double)0x3ff0000000000000;
  local_28.units_.base_units_ = (unit_data)0x1;
  local_28.units_.commodity_ = 0;
  units::pow((double)0x3ff0000000000000,in_XMM1_Qa);
  local_90.value_ = (double)local_40._0_8_;
  local_a8 = (undefined1  [8])0x4020000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_c8,"v1.value()","8.0",&local_90.value_,(double *)local_a8);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x381,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if ((long *)local_90.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_90.value_ + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  local_90.value_ = (double)local_40._8_8_;
  local_90.units_.multiplier_ = (double)local_40._16_8_;
  local_78 = (AssertHelperData *)units::detail::power_const<double>(1.0,3);
  units::detail::unit_data::pow((unit_data *)(units::precise::m + 8),(double)local_78,in_XMM1_Qa);
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (ulong)extraout_EAX;
  local_a8 = (undefined1  [8])local_78;
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            ((internal *)local_c8,"v1.units()","precise::m.pow(3)",(precise_unit *)&local_90,
             (precise_unit *)local_a8);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x382,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if ((long *)local_90.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_90.value_ + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  units::root(&local_90,(fixed_precise_measurement *)local_40,3);
  bVar1 = units::fixed_precise_measurement::operator==(&local_90,&local_28);
  local_a8[0] = bVar1;
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,(internal *)local_a8,(AssertionResult *)"m2 == m1","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x385,(char *)CONCAT71(local_c8._1_7_,local_c8[0]));
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_c8._1_7_,local_c8[0]) != &local_b8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_c8._1_7_,local_c8[0]),local_b8._M_allocated_capacity + 1);
    }
    if ((long *)local_58.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_58.value_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_78 = (AssertHelperData *)units::detail::power_const<double>(1.0,2);
  units::detail::unit_data::pow((unit_data *)(units::precise::m + 8),(double)local_78,in_XMM1_Qa);
  local_98 = (ulong)extraout_EAX_00;
  local_a8 = (undefined1  [8])0x4030000000000000;
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78;
  units::root((fixed_precise_measurement *)local_c8,(fixed_precise_measurement *)local_a8,2);
  local_58.value_ = (double)&DAT_4010000000000000;
  local_58.units_.multiplier_ = (double)0x3ff0000000000000;
  local_58.units_.base_units_ = (unit_data)0x1;
  local_58.units_.commodity_ = 0;
  local_68.data_._0_1_ =
       (internal)
       units::fixed_precise_measurement::operator==((fixed_precise_measurement *)local_c8,&local_58)
  ;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_68.data_._0_1_) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,(internal *)&local_68,
               (AssertionResult *)"sqrt(m4) == fixed_precise_measurement(4.0, precise::m)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x388,(char *)CONCAT71(local_c8._1_7_,local_c8[0]));
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_c8._1_7_,local_c8[0]) != &local_b8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_c8._1_7_,local_c8[0]),local_b8._M_allocated_capacity + 1);
    }
    if ((long *)local_58.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_58.value_ + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  return;
}

Assistant:

TEST(fixedPreciseMeasurement, powroot)
{
    fixed_precise_measurement m1(2.0, precise::m);

    auto v1 = pow(m1, 3);
    EXPECT_EQ(v1.value(), 8.0);
    EXPECT_EQ(v1.units(), precise::m.pow(3));
#ifndef UNITS_HEADER_ONLY
    auto m2 = root(v1, 3);
    EXPECT_TRUE(m2 == m1);

    fixed_precise_measurement m4(16.0, precise::m.pow(2));
    EXPECT_TRUE(sqrt(m4) == fixed_precise_measurement(4.0, precise::m));
#endif
}